

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool __thiscall ImGuiTextFilter::Draw(ImGuiTextFilter *this,char *label,float width)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  int iVar4;
  float *pfVar5;
  
  if ((width != 0.0) || (NAN(width))) {
    ImGui::PushItemWidth(width);
    bVar3 = ImGui::InputText(label,this->InputBuf,0x100,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
    pIVar2 = GImGui->CurrentWindow;
    pIVar2->WriteAccessed = true;
    iVar1 = (pIVar2->DC).ItemWidthStack.Size;
    iVar4 = iVar1 + -1;
    (pIVar2->DC).ItemWidthStack.Size = iVar4;
    if (iVar4 == 0) {
      pfVar5 = &pIVar2->ItemWidthDefault;
    }
    else {
      pfVar5 = (pIVar2->DC).ItemWidthStack.Data + (long)iVar1 + -2;
    }
    (pIVar2->DC).ItemWidth = *pfVar5;
    if (!bVar3) {
      return false;
    }
  }
  else {
    bVar3 = ImGui::InputText(label,this->InputBuf,0x100,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
    if (!bVar3) {
      return false;
    }
  }
  Build(this);
  return true;
}

Assistant:

bool ImGuiTextFilter::Draw(const char* label, float width)
{
    if (width != 0.0f)
        ImGui::PushItemWidth(width);
    bool value_changed = ImGui::InputText(label, InputBuf, IM_ARRAYSIZE(InputBuf));
    if (width != 0.0f)
        ImGui::PopItemWidth();
    if (value_changed)
        Build();
    return value_changed;
}